

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCore.c
# Opt level: O1

Gia_Man_t * Cec_ManSatSolving(Gia_Man_t *pAig,Cec_ParSat_t *pPars)

{
  Cec_ManPat_t *pPat;
  Gia_Man_t *pGVar1;
  
  pPat = Cec_ManPatStart();
  Cec_ManSatSolve(pPat,pAig,pPars);
  pGVar1 = Gia_ManDup(pAig);
  Cec_ManPatStop(pPat);
  return pGVar1;
}

Assistant:

Gia_Man_t * Cec_ManSatSolving( Gia_Man_t * pAig, Cec_ParSat_t * pPars )
{
    Gia_Man_t * pNew;
    Cec_ManPat_t * pPat;
    pPat = Cec_ManPatStart();
    Cec_ManSatSolve( pPat, pAig, pPars );
//    pNew = Gia_ManDupDfsSkip( pAig );
    pNew = Gia_ManDup( pAig );
    Cec_ManPatStop( pPat );
    return pNew;
}